

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

bool __thiscall
miniros::MasterLink::getParamImpl<std::__cxx11::string>
          (MasterLink *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec,bool cached)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  XmlRpcValue *pXVar4;
  long lVar5;
  long lVar6;
  RpcValue xml_array;
  RpcValue local_70;
  XmlRpcValue local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._type = TypeInvalid;
  local_70._value.asDouble = 0.0;
  bVar2 = getParamImpl(this,key,&local_70,cached);
  if (bVar2 && local_70._type == TypeArray) {
    iVar3 = XmlRpc::XmlRpcValue::size(&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(vec,(long)iVar3);
    lVar5 = 0;
    lVar6 = 0;
    while( true ) {
      iVar3 = XmlRpc::XmlRpcValue::size(&local_70);
      bVar2 = iVar3 <= lVar6;
      if (iVar3 <= lVar6) break;
      pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_70,(int)lVar6);
      if (pXVar4->_type != TypeString) break;
      pXVar4 = XmlRpc::XmlRpcValue::operator[](&local_70,(int)lVar6);
      local_60._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_60,pXVar4);
      XmlRpc::XmlRpcValue::assertTypeOrInvalid(&local_60,TypeString);
      pcVar1 = ((local_60._value.asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,
                 ((local_60._value.asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_finish + (long)pcVar1);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((vec->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
                 (string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      XmlRpc::XmlRpcValue::invalidate(&local_60);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
  }
  else {
    bVar2 = false;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_70);
  return bVar2;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::vector<T>& vec, bool cached)
{
  RpcValue xml_array;
  if (!getParamImpl(key, xml_array, cached)) {
    return false;
  }

  // Make sure it's an array type
  if (xml_array.getType() != RpcValue::TypeArray) {
    return false;
  }

  // Resize the target vector (destructive)
  vec.resize(xml_array.size());

  // Fill the vector with stuff
  for (int i = 0; i < xml_array.size(); i++) {
    if (!xml_castable<T>(xml_array[i].getType())) {
      return false;
    }

    vec[i] = xml_cast<T>(xml_array[i]);
  }

  return true;
}